

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::check_basename_match_word_prefix
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  bool bVar1;
  pointer pCVar2;
  reference pcVar3;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> __x;
  reference pcVar4;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  *in_RDI;
  ReverseIterator steal_rlast;
  ReverseIterator steal_rit;
  char32_t c;
  anon_class_56_7_13232ace consume_word_prefix;
  bool prev_alphanumeric;
  bool prev_uppercase;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  props_it;
  const_iterator query_last;
  Iterator query_it;
  const_iterator item_last;
  Iterator item_it;
  char32_t in_stack_ffffffffffffff28;
  char32_t in_stack_ffffffffffffff2c;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  *in_stack_ffffffffffffff30;
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *this_00;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffff40;
  iterator_type in_stack_ffffffffffffff48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_a8;
  char32_t *local_a0;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_98;
  char32_t local_8c;
  byte *local_88;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> *local_80;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> *local_78;
  char32_t **local_70;
  char32_t **local_68;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  *local_60;
  byte *local_58;
  byte local_4a;
  byte local_49;
  char32_t *local_48;
  CharProperties *local_40;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  local_38;
  char32_t *local_30;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_28;
  char32_t *local_20;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  local_18 [2];
  bool local_1;
  
  std::
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ::clear((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
           *)0x1a30c5);
  std::
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ::push_back((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
               *)in_stack_ffffffffffffff40._M_current,(value_type *)in_RDI);
  local_18[0]._M_current = (char32_t *)in_RDI[4]._M_current;
  local_20 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend
                       ((vector<char32_t,_std::allocator<char32_t>_> *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffff30,
                     (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_28._M_current = (char32_t *)in_RDI[8]._M_current;
    local_30 = (char32_t *)
               std::vector<char32_t,_std::allocator<char32_t>_>::cend
                         ((vector<char32_t,_std::allocator<char32_t>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar1 = __gnu_cxx::operator==
                      (in_stack_ffffffffffffff30,
                       (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_40 = (CharProperties *)
                 std::
                 vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
                 ::begin((vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
                          *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      this_00 = (vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                 *)(in_RDI + 4);
      local_48 = (char32_t *)
                 std::vector<char32_t,_std::allocator<char32_t>_>::cbegin
                           ((vector<char32_t,_std::allocator<char32_t>_> *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      __gnu_cxx::operator-
                ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                  *)this_00,
                 (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_38 = __gnu_cxx::
                 __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
                 ::operator+(in_RDI,(difference_type)this_00);
      pCVar2 = __gnu_cxx::
               __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
               ::operator->(&local_38);
      local_49 = pCVar2->uppercase & 1;
      pCVar2 = __gnu_cxx::
               __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
               ::operator->(&local_38);
      local_4a = pCVar2->alphanumeric & 1;
      pCVar2 = __gnu_cxx::
               __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
               ::operator->(&local_38);
      pCVar2->word_start = true;
      local_88 = &local_4a;
      local_80 = local_18;
      local_78 = &local_28;
      local_70 = &local_30;
      local_68 = &local_20;
      local_60 = &local_38;
      local_58 = &local_49;
      check_basename_match_word_prefix::anon_class_56_7_13232ace::operator()
                ((anon_class_56_7_13232ace *)in_stack_ffffffffffffff40._M_current);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                                 *)this_00,
                                (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
            bVar1) {
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)this_00,
                           (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (bVar1) {
          in_RDI[0xd]._M_current = (CharProperties *)0x0;
          in_RDI[0xf]._M_current = (CharProperties *)0x0;
          return false;
        }
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                 ::operator*(local_18);
        in_stack_ffffffffffffff2c = *pcVar3;
        local_8c = in_stack_ffffffffffffff2c;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                 ::operator*(&local_28);
        if (in_stack_ffffffffffffff2c != *pcVar3) {
          local_a0 = local_28._M_current;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
          ::reverse_iterator(&local_98,(iterator_type)local_28._M_current);
          std::
          vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
          ::back(this_00);
          __x = __gnu_cxx::
                __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                ::operator+((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                             *)in_RDI,(difference_type)this_00);
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
          ::reverse_iterator(&local_a8,(iterator_type)__x._M_current);
          while (bVar1 = std::operator<((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                                         *)in_stack_ffffffffffffff40._M_current,
                                        (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                                         *)in_RDI), bVar1) {
            in_stack_ffffffffffffff28 = local_8c;
            pcVar4 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                     ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                                  *)this_00);
            if (in_stack_ffffffffffffff28 == *pcVar4) {
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                           *)in_stack_ffffffffffffff48._M_current,
                          (difference_type)in_stack_ffffffffffffff40._M_current);
              in_stack_ffffffffffffff48 =
                   std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                   ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                           *)&stack0xffffffffffffff40);
              local_28._M_current = in_stack_ffffffffffffff48._M_current;
              break;
            }
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                          *)this_00);
          }
        }
        std::
        vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
        ::push_back((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                     *)in_stack_ffffffffffffff40._M_current,(value_type *)in_RDI);
        check_basename_match_word_prefix::anon_class_56_7_13232ace::operator()
                  ((anon_class_56_7_13232ace *)in_stack_ffffffffffffff40._M_current);
      }
      *(undefined4 *)&in_RDI[0xc]._M_current = 2;
      std::
      vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
      ::push_back((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
                   *)in_stack_ffffffffffffff40._M_current,(value_type *)in_RDI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool check_basename_match_word_prefix() {
    qit_basename_words_.clear();
    qit_basename_words_.push_back(qit_basename_);

    auto item_it = item_basename_;
    auto const item_last = item_.cend();
    if (item_it == item_last) {
      return false;
    }
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    if (query_it == query_last) {
      return false;
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());

    bool prev_uppercase = props_it->uppercase;
    bool prev_alphanumeric = props_it->alphanumeric;
    props_it->word_start = true;

    // Advances `item_it` and `props_it` to the beginning of the next word. For
    // each consecutive iterated character in the item matched by a character
    // in the query before `query_last`, advances `query_it`.
    //
    // Precondition: `item_it != item_last`; `query_it != query_last`.
    // Postcondition: `item_it` is always advanced by at least 1.
    auto const consume_word_prefix = [&] {
      bool can_match = true;
      while (true) {
        // Require that all alphanumeric matches in this word be contiguous.
        if (can_match || !prev_alphanumeric) {
          if (*item_it == *query_it) {
            ++query_it;
            if (query_it == query_last) {
              break;
            }
          } else {
            can_match = false;
          }
        }
        ++item_it;
        if (item_it == item_last) {
          break;
        }
        ++props_it;
        bool const uppercase = props_it->uppercase;
        bool const alphanumeric = props_it->alphanumeric;
        bool const word_start = (!prev_uppercase && uppercase) ||
                                (!prev_alphanumeric && alphanumeric);
        props_it->word_start = word_start;
        prev_uppercase = uppercase;
        prev_alphanumeric = alphanumeric;
        if (word_start) {
          break;
        }
      }
    };

    consume_word_prefix();
    while (query_it != query_last) {
      if (item_it == item_last) {
        basename_longest_submatch_ = 0;
        basename_word_gaps_ = 0;
        return false;
      }
      // If the next unmatched query character doesn't match the first
      // character of the next word, allow partial backtracking (all but the
      // first character) of the match in the previous word in order to find a
      // match for this one.
      auto const c = *item_it;
      if (c != *query_it) {
        for (auto steal_rit = ReverseIterator(query_it),
                  steal_rlast = ReverseIterator(qit_basename_words_.back() + 1);
             steal_rit < steal_rlast; ++steal_rit) {
          if (c == *steal_rit) {
            query_it = (steal_rit + 1).base();
            break;
          }
        }
      }
      qit_basename_words_.push_back(query_it);
      consume_word_prefix();
    }
    prefix_level_ = PrefixLevel::BASENAME_WORD;
    // Push `query_it` onto `qit_basename_words_` even though we know it's
    // `query_.cend()` to avoid special-casing the end case in
    // `score_basename_word_prefix_match`.
    qit_basename_words_.push_back(query_it);
    return true;
  }